

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O3

XXH128_hash_t VELOCYPACK_XXH3_128bits_digest(XXH3_state_t *state)

{
  ulong len;
  XXH64_hash_t XVar1;
  XXH64_hash_t XVar2;
  xxh_u8 *secret;
  size_t secretLen;
  code *f_hl128;
  XXH128_hash_t XVar3;
  XXH64_hash_t acc [8];
  XXH64_hash_t aXStack_68 [8];
  
  len = state->totalLen;
  secret = state->customSecret;
  if (state->extSecret != (uchar *)0x0) {
    secret = state->extSecret;
  }
  if (len < 0xf1) {
    XVar1 = state->seed;
    if (XVar1 == 0) {
      secretLen = state->secretLimit + 0x40;
      f_hl128 = XXH3_hashLong_128b_withSecret;
      XVar1 = 0;
    }
    else {
      secret = XXH3_kSecret;
      f_hl128 = XXH3_hashLong_128b_withSeed;
      secretLen = 0xc0;
    }
    XVar3 = XXH3_128bits_internal(state->buffer,len,XVar1,secret,secretLen,f_hl128);
  }
  else {
    XXH3_digest_long(aXStack_68,state,secret);
    XVar1 = XXH3_mergeAccs(aXStack_68,secret + 0xb,len * -0x61c8864e7a143579);
    XVar2 = XXH3_mergeAccs(aXStack_68,secret + (state->secretLimit - 0xb),
                           ~(len * -0x3d4d51c2d82b14b1));
    XVar3.high64 = XVar2;
    XVar3.low64 = XVar1;
  }
  return XVar3;
}

Assistant:

XXH_PUBLIC_API XXH128_hash_t XXH3_128bits_digest(const XXH3_state_t* state) {
  const unsigned char* const secret =
      (state->extSecret == NULL) ? state->customSecret : state->extSecret;
  if (state->totalLen > XXH3_MIDSIZE_MAX) {
    XXH_ALIGN(XXH_ACC_ALIGN) XXH64_hash_t acc[XXH_ACC_NB];
    XXH3_digest_long(acc, state, secret);
    XXH_ASSERT(state->secretLimit + XXH_STRIPE_LEN >=
               sizeof(acc) + XXH_SECRET_MERGEACCS_START);
    {
      XXH128_hash_t h128;
      h128.low64 = XXH3_mergeAccs(acc, secret + XXH_SECRET_MERGEACCS_START,
                                  (xxh_u64)state->totalLen * XXH_PRIME64_1);
      h128.high64 =
          XXH3_mergeAccs(acc,
                         secret + state->secretLimit + XXH_STRIPE_LEN -
                             sizeof(acc) - XXH_SECRET_MERGEACCS_START,
                         ~((xxh_u64)state->totalLen * XXH_PRIME64_2));
      return h128;
    }
  }
  /* len <= XXH3_MIDSIZE_MAX : short code */
  if (state->seed)
    return XXH3_128bits_withSeed(state->buffer, (size_t)state->totalLen,
                                 state->seed);
  return XXH3_128bits_withSecret(state->buffer, (size_t)(state->totalLen),
                                 secret, state->secretLimit + XXH_STRIPE_LEN);
}